

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VisitorTests.cpp
# Opt level: O0

FunctionPortSyntax * __thiscall
RewriterBase<InterleavedRewriter>::makeArg(RewriterBase<InterleavedRewriter> *this,string_view name)

{
  Token name_00;
  span<const_slang::parsing::Trivia,_18446744073709551615UL> trivia;
  string_view text;
  Token direction;
  Token constKeyword;
  long lVar1;
  Info *pIVar2;
  DeclaratorSyntax *this_00;
  FunctionPortSyntax *pFVar3;
  size_t in_RDI;
  SyntaxList<slang::syntax::VariableDimensionSyntax> *in_stack_fffffffffffffeb8;
  Token *in_stack_fffffffffffffec0;
  nullptr_t in_stack_fffffffffffffec8;
  SyntaxRewriter<InterleavedRewriter> *in_stack_fffffffffffffed0;
  pointer in_stack_fffffffffffffed8;
  __extent_storage<18446744073709551615UL> in_stack_fffffffffffffee0;
  Info *in_stack_ffffffffffffff00;
  Token in_stack_ffffffffffffff10;
  Token in_stack_ffffffffffffff20;
  DataTypeSyntax *in_stack_ffffffffffffff30;
  DeclaratorSyntax *in_stack_ffffffffffffff38;
  
  lVar1 = in_RDI + 0x10;
  slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>::SyntaxList
            ((SyntaxList<slang::syntax::AttributeInstanceSyntax> *)in_stack_fffffffffffffed0,
             in_stack_fffffffffffffec8);
  slang::parsing::Token::Token(in_stack_fffffffffffffec0);
  slang::parsing::Token::Token(in_stack_fffffffffffffec0);
  slang::parsing::Token::Token(in_stack_fffffffffffffec0);
  slang::parsing::Token::Token(in_stack_fffffffffffffec0);
  pIVar2 = (Info *)(in_RDI + 0x10);
  std::span<const_slang::parsing::Trivia,_18446744073709551615UL>::span
            ((span<const_slang::parsing::Trivia,_18446744073709551615UL> *)0x6f2d06);
  text._M_str = (char *)pIVar2;
  text._M_len = in_RDI;
  trivia._M_extent._M_extent_value = in_stack_fffffffffffffee0._M_extent_value;
  trivia._M_ptr = in_stack_fffffffffffffed8;
  slang::syntax::SyntaxRewriter<InterleavedRewriter>::makeId(in_stack_fffffffffffffed0,text,trivia);
  slang::syntax::SyntaxList<slang::syntax::VariableDimensionSyntax>::SyntaxList
            ((SyntaxList<slang::syntax::VariableDimensionSyntax> *)in_stack_fffffffffffffed0,
             in_stack_fffffffffffffec8);
  name_00.info = (Info *)in_stack_fffffffffffffed0;
  name_00._0_8_ = in_stack_fffffffffffffec8;
  this_00 = slang::syntax::SyntaxFactory::declarator
                      ((SyntaxFactory *)in_stack_fffffffffffffec0,name_00,in_stack_fffffffffffffeb8,
                       (EqualsValueClauseSyntax *)0x6f2d72);
  constKeyword.info = in_stack_ffffffffffffff00;
  constKeyword.kind = (short)lVar1;
  constKeyword._2_1_ = (char)((ulong)lVar1 >> 0x10);
  constKeyword.numFlags.raw = (char)((ulong)lVar1 >> 0x18);
  constKeyword.rawLen = (int)((ulong)lVar1 >> 0x20);
  direction.info = pIVar2;
  direction.kind = (short)in_RDI;
  direction._2_1_ = (char)(in_RDI >> 0x10);
  direction.numFlags.raw = (char)(in_RDI >> 0x18);
  direction.rawLen = (int)(in_RDI >> 0x20);
  pFVar3 = slang::syntax::SyntaxFactory::functionPort
                     ((SyntaxFactory *)this_00,
                      (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)0x0,constKeyword,
                      direction,in_stack_ffffffffffffff10,in_stack_ffffffffffffff20,
                      in_stack_ffffffffffffff30,in_stack_ffffffffffffff38);
  return pFVar3;
}

Assistant:

FunctionPortSyntax& makeArg(std::string_view name) {
        return this->factory.functionPort(nullptr, {}, {}, {}, {}, nullptr,
                                          this->factory.declarator(this->makeId(name), nullptr,
                                                                   nullptr));
    }